

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

void __thiscall QGraphicsWidget::initStyleOption(QGraphicsWidget *this,QStyleOption *option)

{
  bool bVar1;
  LayoutDirection LVar2;
  QGraphicsWidget *this_00;
  QGraphicsWidget *in_RSI;
  QGraphicsWidget *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  QWindow *w;
  QPalette *in_stack_ffffffffffffff68;
  QFontMetrics *this_01;
  QPalette *in_stack_ffffffffffffff70;
  QFont *this_02;
  QRectF *in_stack_ffffffffffffff98;
  QGraphicsItem *in_stack_ffffffffffffffa0;
  _func_int **local_3c;
  QGraphicsItemPrivate *local_34;
  undefined4 local_2c;
  QFont local_28 [16];
  QPalette local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QFlags<QStyle::StateFlag>::QFlags
            ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff70,
             (StateFlag)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  *(undefined4 *)&(in_RSI->super_QGraphicsObject).field_0x8 = local_2c;
  bVar1 = QGraphicsItem::isEnabled((QGraphicsItem *)0xa4c2b6);
  if (bVar1) {
    QFlags<QStyle::StateFlag>::operator|=
              ((QFlags<QStyle::StateFlag> *)&(in_RSI->super_QGraphicsObject).field_0x8,State_Enabled
              );
  }
  bVar1 = QGraphicsItem::hasFocus((QGraphicsItem *)in_RDI);
  if (bVar1) {
    QFlags<QStyle::StateFlag>::operator|=
              ((QFlags<QStyle::StateFlag> *)&(in_RSI->super_QGraphicsObject).field_0x8,
               State_HasFocus);
  }
  bVar1 = QGraphicsItem::isUnderMouse(in_stack_ffffffffffffffa0);
  if (bVar1) {
    QFlags<QStyle::StateFlag>::operator|=
              ((QFlags<QStyle::StateFlag> *)&(in_RSI->super_QGraphicsObject).field_0x8,
               State_MouseOver);
  }
  this_00 = QGraphicsItem::window((QGraphicsItem *)in_RDI);
  if ((this_00 != (QGraphicsWidget *)0x0) &&
     (bVar1 = isActiveWindow((QGraphicsWidget *)0xa4c342), bVar1)) {
    QFlags<QStyle::StateFlag>::operator|=
              ((QFlags<QStyle::StateFlag> *)&(in_RSI->super_QGraphicsObject).field_0x8,State_Active)
    ;
  }
  bVar1 = QGraphicsItem::isWindow((QGraphicsItem *)this_00);
  if (bVar1) {
    QFlags<QStyle::StateFlag>::operator|=
              ((QFlags<QStyle::StateFlag> *)&(in_RSI->super_QGraphicsObject).field_0x8,State_Window)
    ;
  }
  LVar2 = layoutDirection((QGraphicsWidget *)0xa4c38e);
  *(LayoutDirection *)&(in_RSI->super_QGraphicsObject).field_0xc = LVar2;
  rect(in_RSI);
  QVar3 = QRectF::toRect(in_stack_ffffffffffffff98);
  local_3c = QVar3._0_8_;
  (in_RSI->super_QGraphicsObject).super_QGraphicsItem._vptr_QGraphicsItem = local_3c;
  local_34 = QVar3._8_8_;
  (in_RSI->super_QGraphicsObject).super_QGraphicsItem.d_ptr.d = local_34;
  palette(in_RDI);
  QPalette::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  QPalette::~QPalette(&local_18);
  bVar1 = QGraphicsItem::isEnabled((QGraphicsItem *)0xa4c415);
  if (bVar1) {
    bVar1 = isActiveWindow((QGraphicsWidget *)0xa4c438);
    if (bVar1) {
      QPalette::setCurrentColorGroup((QPalette *)&(in_RSI->super_QGraphicsLayoutItem).d_ptr,Active);
    }
    else {
      QPalette::setCurrentColorGroup
                ((QPalette *)&(in_RSI->super_QGraphicsLayoutItem).d_ptr,Inactive);
    }
  }
  else {
    QPalette::setCurrentColorGroup((QPalette *)&(in_RSI->super_QGraphicsLayoutItem).d_ptr,Disabled);
  }
  this_02 = local_28;
  font(in_RSI);
  this_01 = (QFontMetrics *)&stack0xffffffffffffff98;
  QFontMetrics::QFontMetrics(this_01,this_02);
  QFontMetrics::operator=((QFontMetrics *)this_02,this_01);
  QFontMetrics::~QFontMetrics(this_01);
  QFont::~QFont(this_02);
  *(QGraphicsWidget **)&in_RSI[1].super_QGraphicsObject.field_0x8 = in_RDI;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidget::initStyleOption(QStyleOption *option) const
{
    Q_ASSERT(option);

    option->state = QStyle::State_None;
    if (isEnabled())
        option->state |= QStyle::State_Enabled;
    if (hasFocus())
        option->state |= QStyle::State_HasFocus;
    // if (window->testAttribute(Qt::WA_KeyboardFocusChange)) // ### Window
    //     option->state |= QStyle::State_KeyboardFocusChange;
    if (isUnderMouse())
        option->state |= QStyle::State_MouseOver;
    if (QGraphicsWidget *w = window()) {
        if (w->isActiveWindow())
            option->state |= QStyle::State_Active;
    }
    if (isWindow())
        option->state |= QStyle::State_Window;
    /*
      ###
#ifdef QT_KEYPAD_NAVIGATION
    if (widget->hasEditFocus())
        state |= QStyle::State_HasEditFocus;
#endif
    */
    option->direction = layoutDirection();
    option->rect = rect().toRect(); // ### truncation!
    option->palette = palette();
    if (!isEnabled()) {
        option->palette.setCurrentColorGroup(QPalette::Disabled);
    } else if (isActiveWindow()) {
        option->palette.setCurrentColorGroup(QPalette::Active);
    } else {
        option->palette.setCurrentColorGroup(QPalette::Inactive);
    }
    option->fontMetrics = QFontMetrics(font());
    option->styleObject = const_cast<QGraphicsWidget *>(this);
}